

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * Strsafe_find(char *key)

{
  s_x1node *psVar1;
  s_x1 *psVar2;
  uint uVar3;
  int iVar4;
  char *__s1;
  s_x1node **ppsVar5;
  
  psVar2 = x1a;
  if (x1a == (s_x1 *)0x0) {
LAB_0010b19d:
    __s1 = (char *)0x0;
  }
  else {
    uVar3 = strhash(key);
    ppsVar5 = psVar2->ht + (psVar2->size - 1U & uVar3);
    do {
      psVar1 = *ppsVar5;
      if (psVar1 == (s_x1node *)0x0) goto LAB_0010b19d;
      __s1 = psVar1->data;
      iVar4 = strcmp(__s1,key);
      ppsVar5 = &psVar1->next;
    } while (iVar4 != 0);
  }
  return __s1;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  unsigned h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}